

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int verify_miniscript_older(miniscript_node_t *node,miniscript_node_t *parent)

{
  int32_t iVar1;
  miniscript_node_t *parent_local;
  miniscript_node_t *node_local;
  
  iVar1 = get_child_list_count(node);
  if ((((iVar1 == node->info->inner_num) && (node->child->info == (miniscript_item_t *)0x0)) &&
      (node->child->kind == 8)) && ((0 < node->child->number && (node->child->number < 0x80000000)))
     ) {
    node->type_properties = node->info->type_properties;
    if ((node->child->number & 0x400000U) == 0) {
      node->type_properties = node->type_properties | 0x80000;
    }
    else {
      node->type_properties = node->type_properties | 0x40000;
    }
    node_local._4_4_ = 0;
  }
  else {
    node_local._4_4_ = -2;
  }
  return node_local._4_4_;
}

Assistant:

static int verify_miniscript_older(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    (void)parent;
    if ((get_child_list_count(node) != node->info->inner_num) || node->child->info ||
        (node->child->kind != DESCRIPTOR_KIND_NUMBER) ||
        (node->child->number <= 0) || (node->child->number > 0x7fffffff))
        return WALLY_EINVAL;

    node->type_properties = node->info->type_properties;
    if (node->child->number & DESCRIPTOR_SEQUENCE_LOCKTIME_TYPE_FLAG) {
        node->type_properties |= MINISCRIPT_PROPERTY_G;
    } else {
        node->type_properties |= MINISCRIPT_PROPERTY_H;
    }
    return WALLY_OK;
}